

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Cylinder(X3DImporter *this)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pFVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  CX3DImporter_NodeElement_Geometry3D *pCVar8;
  reference paVar9;
  float fVar10;
  allocator local_139;
  string local_138;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_118;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_110;
  iterator it_2;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_100;
  iterator it_1;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_f0;
  iterator it;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vlist;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tcir;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tside;
  uint tess;
  undefined1 local_a0 [8];
  string an;
  uint local_6c;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  bool top;
  bool solid;
  float fStack_58;
  bool side;
  float radius;
  float height;
  bool bottom;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&height);
  radius._3_1_ = 1;
  fStack_58 = 2.0;
  ne._4_4_ = 1.0;
  ne._3_1_ = 1;
  ne._2_1_ = 1;
  ne._1_1_ = 1;
  _idx_end = (CX3DImporter_NodeElement_Geometry3D *)0x0;
  local_6c = 0;
  pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar3 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_6c < iVar3; local_6c = local_6c + 1) {
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar6,(ulong)local_6c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar4),
               (allocator *)((long)&tess + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&tess + 3));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"DEF");
    if (bVar2) {
      pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar6,(ulong)local_6c);
      std::__cxx11::string::operator=((string *)&height,(char *)CONCAT44(extraout_var_00,iVar4));
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"USE");
      if (bVar2) {
        pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar6,(ulong)local_6c);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar4))
        ;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0,"bboxCenter");
        if (((!bVar2) &&
            (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a0,"bboxSize"), !bVar2)) &&
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"containerField"), !bVar2)) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"radius");
          if (bVar2) {
            ne._4_4_ = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"solid");
            if (bVar2) {
              ne._2_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_6c);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,"bottom");
              if (bVar2) {
                radius._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_6c);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,"top");
                if (bVar2) {
                  ne._1_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_6c);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_a0,"side");
                  if (bVar2) {
                    ne._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_6c);
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_a0,"height");
                    if (bVar2) {
                      fStack_58 = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
                    }
                    else {
                      Throw_IncorrectAttr(this,(string *)local_a0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Cylinder,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar2) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
    pCVar8 = (CX3DImporter_NodeElement_Geometry3D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry3D::CX3DImporter_NodeElement_Geometry3D
              (pCVar8,ENET_Cylinder,this->NodeElement_Cur);
    _idx_end = pCVar8;
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,(string *)&height);
    }
    if ((ne._3_1_ & 1) != 0) {
      StandardShapes::MakeCone
                (fStack_58,ne._4_4_,ne._4_4_,0x1e,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,true);
    }
    fStack_58 = fStack_58 / 2.0;
    if (((ne._1_1_ & 1) != 0) || ((radius._3_1_ & 1) != 0)) {
      StandardShapes::MakeCircle
                (ne._4_4_,0x1e,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
    }
    it._M_current = (aiVector3t<float> *)&_idx_end->Vertices;
    local_f0._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    &tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      it_1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &tcir.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_f0,&it_1);
      iVar1 = it;
      if (!bVar2) break;
      paVar9 = __gnu_cxx::
               __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator*(&local_f0);
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)iVar1._M_current,
                 paVar9);
      __gnu_cxx::
      __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
      ::operator++(&local_f0);
    }
    if ((ne._1_1_ & 1) != 0) {
      local_100._M_current =
           (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
      while( true ) {
        it_2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
        bVar2 = __gnu_cxx::operator!=(&local_100,&it_2);
        fVar10 = fStack_58;
        if (!bVar2) break;
        paVar9 = __gnu_cxx::
                 __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                 ::operator*(&local_100);
        iVar1 = it;
        paVar9->y = fVar10;
        paVar9 = __gnu_cxx::
                 __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                 ::operator*(&local_100);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)iVar1._M_current,
                   paVar9);
        __gnu_cxx::
        __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
        ::operator++(&local_100);
      }
    }
    if ((radius._3_1_ & 1) != 0) {
      local_110._M_current =
           (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
      while( true ) {
        local_118._M_current =
             (aiVector3t<float> *)
             std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
        bVar2 = __gnu_cxx::operator!=(&local_110,&local_118);
        if (!bVar2) break;
        fVar10 = -fStack_58;
        paVar9 = __gnu_cxx::
                 __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                 ::operator*(&local_110);
        iVar1 = it;
        paVar9->y = fVar10;
        paVar9 = __gnu_cxx::
                 __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                 ::operator*(&local_110);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)iVar1._M_current,
                   paVar9);
        __gnu_cxx::
        __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
        ::operator++(&local_110);
      }
    }
    _idx_end->Solid = (bool)(ne._2_1_ & 1);
    _idx_end->NumIndices = 3;
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar5 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar8 = _idx_end;
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"Cylinder",&local_139);
      ParseNode_Metadata(this,&pCVar8->super_CX3DImporter_NodeElement,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vlist);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)&height);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Cylinder()
{
    std::string use, def;
    bool bottom = true;
    float height = 2;
    float radius = 1;
    bool side = true;
    bool solid = true;
    bool top = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("bottom", bottom, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("top", top, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("side", side, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Cylinder, ne);
	}
	else
	{
		const unsigned int tess = 30;///TODO: IME tessellation factor through ai_property

		std::vector<aiVector3D> tside;// temp array for vertices of side.
		std::vector<aiVector3D> tcir;// temp array for vertices of circle.

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Cylinder, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// make cilynder or parts according to flags.
		if(side) StandardShapes::MakeCone(height, radius, radius, tess, tside, true);

		height /= 2;// height defined for whole cylinder, when creating top and bottom circle we are using just half of height.
		if(top || bottom) StandardShapes::MakeCircle(radius, tess, tcir);
		// copy data from temp arrays
		std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices;// just short alias.

		for(std::vector<aiVector3D>::iterator it = tside.begin(); it != tside.end(); ++it) vlist.push_back(*it);

		if(top)
		{
			for(std::vector<aiVector3D>::iterator it = tcir.begin(); it != tcir.end(); ++it)
			{
				(*it).y = height;// y - because circle made in oXZ.
				vlist.push_back(*it);
			}
		}// if(top)

		if(bottom)
		{
			for(std::vector<aiVector3D>::iterator it = tcir.begin(); it != tcir.end(); ++it)
			{
				(*it).y = -height;// y - because circle made in oXZ.
				vlist.push_back(*it);
			}
		}// if(top)

		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Cylinder");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}